

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  pointer pTVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  char *pcVar7;
  DIR *__dirp;
  dirent *pdVar8;
  Template *this;
  Template *this_00;
  Template *this_01;
  Template *this_02;
  Template *this_03;
  Template *this_04;
  TemplateDictionary *pTVar9;
  uint uVar10;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_05;
  string *psVar11;
  char *pcVar12;
  pointer pbVar13;
  string *a;
  pointer pTVar14;
  long lVar15;
  pointer pbVar16;
  string fname;
  int local_1a4;
  vector<Testdata,_std::allocator<Testdata>_> testdata;
  string stroutput_none;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  string stroutput_ws;
  string stroutput_strnone;
  string stroutput_strws;
  string rootdir;
  
  pcVar7 = getenv("TEMPLATE_ROOTDIR");
  pcVar12 = ".";
  if (pcVar7 != (char *)0x0) {
    pcVar12 = pcVar7;
  }
  std::__cxx11::string::string((string *)&stroutput_none,pcVar12,(allocator *)&stroutput_ws);
  std::__cxx11::string::string((string *)&fname,"src",(allocator *)&stroutput_strnone);
  ctemplate::PathJoin((string *)&rootdir,(string *)&stroutput_none);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&stroutput_none);
  std::__cxx11::string::string((string *)&fname,"tests",(allocator *)&stroutput_ws);
  ctemplate::PathJoin((string *)&stroutput_none,(string *)&rootdir);
  std::__cxx11::string::operator=((string *)&rootdir,(string *)&stroutput_none);
  std::__cxx11::string::~string((string *)&stroutput_none);
  std::__cxx11::string::~string((string *)&fname);
  ctemplate::Template::SetTemplateRootDirectory(&rootdir);
  ctemplate::Template::template_root_directory_abi_cxx11_();
  _Var3 = stroutput_strnone._M_dataplus;
  testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dirp = opendir(stroutput_strnone._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    pcVar12 = "opendir";
  }
  else {
    while( true ) {
      pdVar8 = readdir(__dirp);
      if (pdVar8 == (dirent *)0x0) break;
      iVar6 = strncmp(pdVar8->d_name,"template_unittest_test",0x16);
      if (iVar6 == 0) {
        std::__cxx11::string::string((string *)&stroutput_none,pdVar8->d_name,(allocator *)&fname);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&namelist,
                   &stroutput_none);
        std::__cxx11::string::~string((string *)&stroutput_none);
      }
    }
    iVar6 = closedir(__dirp);
    if (iVar6 == 0) {
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (namelist.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_1a4 = 1;
      pbVar13 = namelist.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar13 ==
            namelist.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&namelist);
          std::__cxx11::string::~string((string *)&stroutput_strnone);
          pTVar2 = testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
              super__Vector_impl_data._M_start ==
              testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pcVar12 = "FATAL ERROR: No test files found for template_regtest";
          }
          else {
            for (pTVar14 = testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                           super__Vector_impl_data._M_start; local_1a4 = 0, pTVar14 != pTVar2;
                pTVar14 = pTVar14 + 1) {
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template_name)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template_name)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this = (Template *)
                     ctemplate::Template::GetTemplate
                               ((TemplateString *)&stroutput_none,DO_NOT_STRIP);
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template_name)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template_name)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this_00 = (Template *)
                        ctemplate::Template::GetTemplate
                                  ((TemplateString *)&stroutput_none,STRIP_BLANK_LINES);
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template_name)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template_name)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this_01 = (Template *)
                        ctemplate::Template::GetTemplate
                                  ((TemplateString *)&stroutput_none,STRIP_WHITESPACE);
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this_02 = (Template *)
                        ctemplate::Template::StringToTemplate
                                  ((TemplateString *)&stroutput_none,DO_NOT_STRIP);
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this_03 = (Template *)
                        ctemplate::Template::StringToTemplate
                                  ((TemplateString *)&stroutput_none,STRIP_BLANK_LINES);
              stroutput_none._M_dataplus._M_p = (pTVar14->input_template)._M_dataplus._M_p;
              stroutput_none._M_string_length = (pTVar14->input_template)._M_string_length;
              stroutput_none.field_2._M_allocated_capacity =
                   stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
              stroutput_none.field_2._8_8_ = 0;
              this_04 = (Template *)
                        ctemplate::Template::StringToTemplate
                                  ((TemplateString *)&stroutput_none,STRIP_WHITESPACE);
              psVar11 = (pTVar14->output).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              for (a = psVar11;
                  a != (pTVar14->output).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; a = a + 1) {
                if (a->_M_string_length != 0) {
                  uVar10 = (int)((ulong)((long)psVar11 -
                                        (long)(pTVar14->output).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) + 1;
                  printf("Testing template %s on dict #%d\n",
                         (pTVar14->input_template_name)._M_dataplus._M_p,(ulong)uVar10);
                  if (this_01 == (Template *)0x0 ||
                      (this_00 == (Template *)0x0 || this == (Template *)0x0)) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x19d,"tpl_none && tpl_lines && tpl_ws");
                    __assert_fail("tpl_none && tpl_lines && tpl_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x19d,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  if (this_04 == (Template *)0x0 ||
                      (this_03 == (Template *)0x0 || this_02 == (Template *)0x0)) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x19e,"tplstr_none && tplstr_lines && tplstr_ws");
                    __assert_fail("tplstr_none && tplstr_lines && tplstr_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x19e,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  pTVar9 = MakeDictionary(uVar10);
                  stroutput_none._M_dataplus._M_p = (pointer)&stroutput_none.field_2;
                  stroutput_none._M_string_length = 0;
                  stroutput_none.field_2._M_allocated_capacity =
                       stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  fname._M_dataplus._M_p = (pointer)&fname.field_2;
                  fname._M_string_length = 0;
                  fname.field_2._M_local_buf[0] = '\0';
                  stroutput_ws._M_dataplus._M_p = (pointer)&stroutput_ws.field_2;
                  stroutput_ws._M_string_length = 0;
                  stroutput_strnone._M_dataplus._M_p = (pointer)&stroutput_strnone.field_2;
                  stroutput_strnone._M_string_length = 0;
                  namelist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)&namelist.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  namelist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  stroutput_ws.field_2._M_local_buf[0] = '\0';
                  stroutput_strnone.field_2._M_local_buf[0] = '\0';
                  namelist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)namelist.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  stroutput_strws._M_dataplus._M_p = (pointer)&stroutput_strws.field_2;
                  stroutput_strws._M_string_length = 0;
                  stroutput_strws.field_2._M_local_buf[0] = '\0';
                  ctemplate::Template::Expand
                            (this,&stroutput_none,(TemplateDictionaryInterface *)pTVar9);
                  ctemplate::Template::Expand(this_00,&fname,(TemplateDictionaryInterface *)pTVar9);
                  ctemplate::Template::Expand
                            (this_01,&stroutput_ws,(TemplateDictionaryInterface *)pTVar9);
                  ctemplate::Template::Expand
                            (this_02,&stroutput_strnone,(TemplateDictionaryInterface *)pTVar9);
                  ctemplate::Template::Expand
                            (this_03,(string *)&namelist,(TemplateDictionaryInterface *)pTVar9);
                  ctemplate::Template::Expand
                            (this_04,&stroutput_strws,(TemplateDictionaryInterface *)pTVar9);
                  bVar4 = StringEq(a,&stroutput_ws,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                   ,0x1ad,"*out","stroutput_ws");
                  if (!bVar4) {
                    __assert_fail("StringEq(*out, stroutput_ws, __FILE__, __LINE__, \"*out\", \"stroutput_ws\")"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1ad,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  bVar4 = std::operator!=(&stroutput_none,&stroutput_ws);
                  if (!bVar4) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1b2,"stroutput_none != stroutput_ws");
                    bVar4 = std::operator!=(&stroutput_none,&stroutput_ws);
                    if (!bVar4) {
                      __assert_fail("stroutput_none != stroutput_ws",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1b2,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  bVar4 = std::operator!=(&fname,&stroutput_ws);
                  _Var3 = stroutput_none._M_dataplus;
                  if (!bVar4) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1b3,"stroutput_lines != stroutput_ws");
                    bVar4 = std::operator!=(&fname,&stroutput_ws);
                    if (!bVar4) {
                      __assert_fail("stroutput_lines != stroutput_ws",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1b3,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  bVar4 = StreqExcept(stroutput_none._M_dataplus._M_p,fname._M_dataplus._M_p,
                                      " \t\v\f\r\n");
                  if (!bVar4) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1b5,
                           "StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                          );
                    bVar4 = StreqExcept(stroutput_none._M_dataplus._M_p,fname._M_dataplus._M_p,
                                        " \t\v\f\r\n");
                    if (!bVar4) {
                      __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1b5,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  bVar4 = StreqExcept(_Var3._M_p,stroutput_ws._M_dataplus._M_p," \t\v\f\r\n");
                  if (!bVar4) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1b7,
                           "StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                          );
                    bVar4 = StreqExcept(stroutput_none._M_dataplus._M_p,
                                        stroutput_ws._M_dataplus._M_p," \t\v\f\r\n");
                    if (!bVar4) {
                      __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1b7,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  _Var5 = std::operator==(&stroutput_none,&stroutput_strnone);
                  if (!_Var5) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1ba,"stroutput_none == stroutput_strnone");
                    _Var5 = std::operator==(&stroutput_none,&stroutput_strnone);
                    if (!_Var5) {
                      __assert_fail("stroutput_none == stroutput_strnone",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1ba,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  _Var5 = std::operator==(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&namelist);
                  if (!_Var5) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1bb,"stroutput_lines == stroutput_strlines");
                    _Var5 = std::operator==(&fname,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&namelist);
                    if (!_Var5) {
                      __assert_fail("stroutput_lines == stroutput_strlines",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1bb,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  _Var5 = std::operator==(&stroutput_ws,&stroutput_strws);
                  if (!_Var5) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1bc,"stroutput_ws == stroutput_strws");
                    _Var5 = std::operator==(&stroutput_ws,&stroutput_strws);
                    if (!_Var5) {
                      __assert_fail("stroutput_ws == stroutput_strws",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1bc,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  (**(code **)(*(long *)pTVar9 + 8))(pTVar9);
                  std::__cxx11::string::~string((string *)&stroutput_strws);
                  std::__cxx11::string::~string((string *)&namelist);
                  std::__cxx11::string::~string((string *)&stroutput_strnone);
                  std::__cxx11::string::~string((string *)&stroutput_ws);
                  std::__cxx11::string::~string((string *)&fname);
                  std::__cxx11::string::~string((string *)&stroutput_none);
                }
                psVar11 = psVar11 + 1;
              }
              pbVar13 = (pTVar14->annotated_output).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              for (pbVar16 = pbVar13;
                  pbVar16 !=
                  (pTVar14->annotated_output).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = pbVar16 + 1) {
                if (pbVar16->_M_string_length != 0) {
                  uVar10 = (int)((ulong)((long)pbVar13 -
                                        (long)(pTVar14->annotated_output).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) + 1;
                  printf("Testing template %s on dict #%d (annotated)\n",
                         (pTVar14->input_template_name)._M_dataplus._M_p,(ulong)uVar10);
                  pTVar9 = MakeDictionary(uVar10);
                  stroutput_none.field_2._8_8_ = 0;
                  stroutput_none._M_string_length = 0;
                  stroutput_none.field_2._M_allocated_capacity = 0;
                  stroutput_none._M_dataplus._M_p = "template_unittest_test";
                  fname._M_dataplus._M_p = (pointer)&fname.field_2;
                  fname._M_string_length = 0;
                  fname.field_2._M_local_buf[0] = '\0';
                  ctemplate::Template::ExpandWithData
                            (this_00,&fname,(TemplateDictionaryInterface *)pTVar9,
                             (PerExpandData *)&stroutput_none);
                  bVar4 = StreqExcept((pbVar16->_M_dataplus)._M_p,fname._M_dataplus._M_p,"\r\n");
                  if (!bVar4) {
                    printf("%s: %d: ASSERT FAILED: %s\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                           ,0x1d2,"StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")");
                    bVar4 = StreqExcept((pbVar16->_M_dataplus)._M_p,fname._M_dataplus._M_p,"\r\n");
                    if (!bVar4) {
                      __assert_fail("StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                    ,0x1d2,
                                    "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                   );
                    }
                    goto LAB_001063f2;
                  }
                  (**(code **)(*(long *)pTVar9 + 8))(pTVar9);
                  std::__cxx11::string::~string((string *)&fname);
                  ctemplate::PerExpandData::~PerExpandData((PerExpandData *)&stroutput_none);
                }
                pbVar13 = pbVar13 + 1;
              }
              if (this_02 != (Template *)0x0) {
                (**(code **)(*(long *)this_02 + 8))();
              }
              if (this_03 != (Template *)0x0) {
                (**(code **)(*(long *)this_03 + 8))();
              }
              if (this_04 != (Template *)0x0) {
                (**(code **)(*(long *)this_04 + 8))(this_04);
              }
            }
            pcVar12 = "DONE";
          }
          puts(pcVar12);
          std::vector<Testdata,_std::allocator<Testdata>_>::~vector(&testdata);
          std::__cxx11::string::~string((string *)&rootdir);
          return local_1a4;
        }
        std::__cxx11::string::string
                  ((string *)&stroutput_ws,_Var3._M_p,(allocator *)&stroutput_strws);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stroutput_none,&stroutput_ws,"/");
        std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &stroutput_none,(pbVar13->_M_dataplus)._M_p);
        std::__cxx11::string::~string((string *)&stroutput_none);
        std::__cxx11::string::~string((string *)&stroutput_ws);
        std::__cxx11::string::string((string *)&stroutput_none,".in",(allocator *)&stroutput_ws);
        bVar4 = EndsWith(&fname,&stroutput_none);
        std::__cxx11::string::~string((string *)&stroutput_none);
        if (bVar4) {
          stroutput_none._M_dataplus._M_p = (pointer)&stroutput_none.field_2;
          stroutput_none.field_2._M_allocated_capacity = 0;
          stroutput_none.field_2._8_8_ = 0;
          stroutput_none._M_string_length = 0;
          std::vector<Testdata,_std::allocator<Testdata>_>::emplace_back<Testdata>
                    (&testdata,(Testdata *)&stroutput_none);
          Testdata::~Testdata((Testdata *)&stroutput_none);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1));
          ReadToString(&fname,&testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>.
                               _M_impl.super__Vector_impl_data._M_finish[-1].input_template);
        }
        else {
          std::__cxx11::string::string((string *)&stroutput_none,".out",(allocator *)&stroutput_ws);
          bVar4 = EndsWith(&fname,&stroutput_none);
          std::__cxx11::string::~string((string *)&stroutput_none);
          lVar15 = -0x30;
          if (!bVar4) {
            std::__cxx11::string::string
                      ((string *)&stroutput_none,".anno_out",(allocator *)&stroutput_ws);
            bVar4 = EndsWith(&fname,&stroutput_none);
            std::__cxx11::string::~string((string *)&stroutput_none);
            lVar15 = -0x18;
            if (!bVar4) {
              printf("%s: %d: ASSERT FAILED: %s\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                     ,199,"false");
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                            ,199,"vector<Testdata> ReadDataFiles(const char *)");
            }
          }
          pTVar2 = testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
              super__Vector_impl_data._M_start ==
              testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            printf("%s: %d: ASSERT FAILED: %s\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                   ,0xca,"!retval.empty()");
            if (testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_start ==
                testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __assert_fail("!retval.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                            ,0xca,"vector<Testdata> ReadDataFiles(const char *)");
            }
            goto LAB_001063f2;
          }
          sVar1 = testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].input_template_name._M_string_length;
          if (pbVar13->_M_string_length <= sVar1 + 4) {
            printf("%s: %d: ASSERT FAILED: %s\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                   ,0xcb,"it->length() > retval.back().input_template_name.length() + 4");
            if (pbVar13->_M_string_length <=
                testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].input_template_name._M_string_length + 4) {
              __assert_fail("it->length() > retval.back().input_template_name.length() + 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                            ,0xcb,"vector<Testdata> ReadDataFiles(const char *)");
            }
            goto LAB_001063f2;
          }
          iVar6 = atoi((pbVar13->_M_dataplus)._M_p + sVar1 + 2);
          if (iVar6 == 0) {
            printf("%s: %d: ASSERT FAILED: %s\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                   ,0xd0,"dictnum");
            __assert_fail("dictnum",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                          ,0xd0,"vector<Testdata> ReadDataFiles(const char *)");
          }
          this_05 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    ((long)&(pTVar2->input_template_name)._M_dataplus._M_p + lVar15);
          while ((ulong)(*(long *)(this_05 + 8) - *(long *)this_05 >> 5) < (ulong)(long)iVar6) {
            stroutput_none._M_dataplus._M_p = (pointer)&stroutput_none.field_2;
            stroutput_none._M_string_length = 0;
            stroutput_none.field_2._M_allocated_capacity =
                 stroutput_none.field_2._M_allocated_capacity & 0xffffffffffffff00;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (this_05,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stroutput_none);
            std::__cxx11::string::~string((string *)&stroutput_none);
          }
          ReadToString(&fname,(string *)(*(long *)this_05 + (long)iVar6 * 0x20 + -0x20));
        }
        std::__cxx11::string::~string((string *)&fname);
        pbVar13 = pbVar13 + 1;
      } while( true );
    }
    pcVar12 = "closedir";
  }
  perror(pcVar12);
LAB_001063f2:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string rootdir = GOOGLE_NAMESPACE::PathJoin(template_rootdir, "src");
  rootdir = GOOGLE_NAMESPACE::PathJoin(rootdir, "tests");
  Template::SetTemplateRootDirectory(rootdir);

  vector<Testdata> testdata = ReadDataFiles(
      Template::template_root_directory().c_str());
  if (testdata.empty()) {
    printf("FATAL ERROR: No test files found for template_regtest\n");
    return 1;
  }

  TestExpand(testdata.begin(), testdata.end());

  printf("DONE\n");
  return 0;
}